

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::
AllocDecommitPages<BVStatic<272ul>,false>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint pageCount,
          BVStatic<272UL> freePages,BVStatic<272UL> decommitPages)

{
  PageBitVector *this_00;
  ulong *puVar1;
  uint uVar2;
  undefined4 *puVar3;
  SecondaryAllocator *pSVar4;
  PageAllocatorBaseCommon *pPVar5;
  code *pcVar6;
  bool bVar7;
  BOOLEAN BVar8;
  BVIndex BVar9;
  int iVar10;
  BVIndex BVar11;
  uint uVar12;
  ulong uVar13;
  PreReservedVirtualAllocWrapper *this_01;
  char *pcVar14;
  long lVar15;
  AllocatorType *pAVar16;
  char cVar17;
  BVIndex BVar18;
  PageBitVector *this_02;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_03;
  char *unaff_R13;
  ulong uVar19;
  char *lpAddress;
  undefined8 *in_FS_OFFSET;
  undefined1 auStack_a8 [8];
  BVStatic<272UL> freeAndDecommitPages;
  
  BVar11 = this->freePageCount;
  this_02 = &this->freePages;
  BVar9 = BVStatic<272UL>::Count(this_02);
  if (BVar11 != BVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x192,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar7) goto LAB_00265b73;
    *puVar3 = 0;
  }
  BVar11 = this->decommitPageCount;
  this_00 = &this->decommitPages;
  BVar9 = BVStatic<272UL>::Count(this_00);
  if (BVar11 != BVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x193,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar7) goto LAB_00265b73;
    *puVar3 = 0;
  }
  if (this->decommitPageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x194,"(decommitPageCount != 0)","decommitPageCount != 0");
    if (!bVar7) goto LAB_00265b73;
    *puVar3 = 0;
  }
  if (pageCount <= this->decommitPageCount + this->freePageCount) {
    pSVar4 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).secondaryAllocator;
    if ((pSVar4 != (SecondaryAllocator *)0x0) &&
       (iVar10 = (*pSVar4->_vptr_SecondaryAllocator[3])(), (char)iVar10 == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)*in_FS_OFFSET;
      *puVar3 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x199,
                         "(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate())"
                         ,
                         "this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate()"
                        );
      if (!bVar7) {
LAB_00265b73:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar3 = 0;
    }
    freeAndDecommitPages.data[3] = freePages.data[4];
    freeAndDecommitPages.data[1] = freePages.data[2];
    freeAndDecommitPages.data[2] = freePages.data[3];
    auStack_a8 = (undefined1  [8])freePages.data[0].word;
    freeAndDecommitPages.data[0] = freePages.data[1];
    lVar15 = 0;
    do {
      puVar1 = (ulong *)((long)(freeAndDecommitPages.data + -1) + lVar15);
      *puVar1 = *puVar1 | *(ulong *)((long)&decommitPages.data[0].word + lVar15);
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x28);
    uVar2 = this->freePageCount;
    BVar11 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_a8,0);
    if (BVar11 == 0xffffffff) {
      return (char *)0x0;
    }
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    uVar13 = (ulong)pageCount * 0x1000;
    do {
      pPVar5 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               super_SegmentBaseCommon.allocator;
      pAVar16 = &pPVar5[-1].allocatorType;
      if (pPVar5 == (PageAllocatorBaseCommon *)0x0) {
        pAVar16 = (AllocatorType *)0x0;
      }
      if (pAVar16[0x28] <= BVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x1a3,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar7) goto LAB_00265b73;
        *puVar3 = 0;
      }
      uVar12 = GetAvailablePageCount(this);
      if (uVar12 - BVar11 < pageCount) {
        return (char *)0x0;
      }
      if ((pageCount == 1) ||
         (BVar8 = BVStatic<272UL>::TestRange((BVStatic<272UL> *)auStack_a8,BVar11,pageCount),
         BVar8 != '\0')) {
        lpAddress = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                    (BVar11 << 0xc);
        cVar17 = '\0';
        uVar19 = uVar13 - 1 & (ulong)lpAddress;
        if (uVar19 != 0) {
          BVar9 = (int)((ulong)lpAddress % uVar13 >> 0xc) + BVar11;
          pPVar5 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                   super_SegmentBaseCommon.allocator;
          pAVar16 = &pPVar5[-1].allocatorType;
          if (pPVar5 == (PageAllocatorBaseCommon *)0x0) {
            pAVar16 = (AllocatorType *)0x0;
          }
          if (BVar9 < pAVar16[0x28]) {
            BVar11 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_a8,BVar9);
            cVar17 = '\n';
          }
          else {
            cVar17 = '\x01';
            unaff_R13 = (char *)0x0;
          }
        }
        if (uVar19 == 0) {
          pPVar5 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                   super_SegmentBaseCommon.allocator;
          this_03 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                     *)&pPVar5[-1].allocatorType;
          if (pPVar5 == (PageAllocatorBaseCommon *)0x0) {
            this_03 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                       *)0x0;
          }
          this_01 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    ::GetVirtualAllocator(this_03);
          pPVar5 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                   super_SegmentBaseCommon.allocator;
          pAVar16 = &pPVar5[-1].allocatorType;
          if (pPVar5 == (PageAllocatorBaseCommon *)0x0) {
            pAVar16 = (AllocatorType *)0x0;
          }
          pcVar14 = (char *)PreReservedVirtualAllocWrapper::AllocPages
                                      (this_01,lpAddress,(ulong)pageCount,0x1000,4,
                                       pAVar16[0x50] == 2);
          if (pcVar14 == (char *)0x0) {
            cVar17 = pageCount == 1;
            if (pageCount == 1) {
              unaff_R13 = (char *)0x0;
            }
          }
          else {
            if (pcVar14 != lpAddress) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar3 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1be,"(ret == pages)","ret == pages");
              if (!bVar7) goto LAB_00265b73;
              *puVar3 = 0;
            }
            BVStatic<272UL>::ClearRange(this_02,BVar11,pageCount);
            BVStatic<272UL>::ClearRange(this_00,BVar11,pageCount);
            BVar9 = BVStatic<272UL>::Count(this_02);
            BVar18 = (this->freePageCount - uVar2) + BVar9;
            this->freePageCount = BVar18;
            this->decommitPageCount = this->decommitPageCount + (uVar2 - (BVar9 + pageCount));
            BVar9 = BVStatic<272UL>::Count(this_02);
            if (BVar18 != BVar9) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar3 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1c7,"(freePageCount == (uint)this->GetCountOfFreePages())",
                                 "freePageCount == (uint)this->GetCountOfFreePages()");
              if (!bVar7) goto LAB_00265b73;
              *puVar3 = 0;
            }
            BVar9 = this->decommitPageCount;
            BVar18 = BVStatic<272UL>::Count(this_00);
            cVar17 = '\x01';
            unaff_R13 = lpAddress;
            if (BVar9 != BVar18) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar3 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1c8,
                                 "(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                                 "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
              if (!bVar7) goto LAB_00265b73;
              *puVar3 = 0;
            }
          }
        }
        if (cVar17 == '\0') goto LAB_00265b34;
        if (cVar17 != '\n') {
          return unaff_R13;
        }
      }
      else {
LAB_00265b34:
        BVar11 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_a8,BVar11 + 1);
      }
    } while (BVar11 != 0xffffffff);
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<TVirtualAlloc>::AllocDecommitPages(uint pageCount, T freePages, T decommitPages)
{
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    Assert(decommitPageCount ==  (uint)this->GetCountOfDecommitPages());
    Assert(decommitPageCount != 0);
    if (freePageCount + decommitPageCount < pageCount)
    {
        return nullptr;
    }
    Assert(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate());

    T freeAndDecommitPages = freePages;

    freeAndDecommitPages.Or(&decommitPages);

    uint oldFreePageCount = freePageCount;
    uint index = freeAndDecommitPages.GetNextBit(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || freeAndDecommitPages.TestRange(index, pageCount))
        {
            char * pages = this->address + index * AutoSystemInfo::PageSize;

            if (!notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(pages, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = freeAndDecommitPages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            void * ret = this->GetAllocator()->GetVirtualAllocator()->AllocPages(pages, pageCount, MEM_COMMIT, PAGE_READWRITE, this->IsInCustomHeapAllocator());
            if (ret != nullptr)
            {
                Assert(ret == pages);

                this->ClearRangeInFreePagesBitVector(index, pageCount);
                this->ClearRangeInDecommitPagesBitVector(index, pageCount);

                uint newFreePageCount = this->GetCountOfFreePages();
                freePageCount = freePageCount - oldFreePageCount + newFreePageCount;
                decommitPageCount -= pageCount - (oldFreePageCount - newFreePageCount);

                Assert(freePageCount == (uint)this->GetCountOfFreePages());
                Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());

                return pages;
            }
            else if (pageCount == 1)
            {
                // if we failed to commit one page, we should just give up.
                return nullptr;
            }
        }
        index = freeAndDecommitPages.GetNextBit(index + 1);
    }

    return nullptr;
}